

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamReaderPrivate::GetNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  string message;
  string alError;
  string local_78;
  string local_58;
  string local_38;
  
  bVar2 = GetNextAlignmentCore(this,alignment);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)&alignment->Filename);
    bVar2 = BamAlignment::BuildCharData(alignment);
    if (bVar2) {
      return true;
    }
    BamAlignment::GetErrorString_abi_cxx11_(&local_38,alignment);
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"could not populate alignment data: \n\t","");
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)local_38._M_dataplus._M_p);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_58.field_2._M_allocated_capacity = *psVar4;
      local_58.field_2._8_8_ = plVar3[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar4;
      local_58._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_58._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"BamReader::GetNextAlignment","");
    SetErrorString(this,&local_78,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return false;
}

Assistant:

bool BamReaderPrivate::GetNextAlignment(BamAlignment& alignment)
{

    // if valid alignment found
    if (GetNextAlignmentCore(alignment)) {

        // store alignment's "source" filename
        alignment.Filename = m_filename;

        // return success/failure of parsing char data
        if (alignment.BuildCharData())
            return true;
        else {
            const std::string alError = alignment.GetErrorString();
            const std::string message =
                std::string("could not populate alignment data: \n\t") + alError;
            SetErrorString("BamReader::GetNextAlignment", message);
            return false;
        }
    }

    // no valid alignment found
    return false;
}